

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O0

int ffdblk(fitsfile *fptr,long nblocks,int *status)

{
  long lVar1;
  int iVar2;
  fitsfile *fptr_00;
  int *in_RDX;
  long in_RSI;
  long in_RDI;
  LONGLONG writepos;
  LONGLONG readpos;
  int ii;
  int tstatus;
  char buffer [2880];
  undefined7 in_stack_fffffffffffff478;
  byte bVar3;
  fitsfile *status_00;
  undefined4 in_stack_fffffffffffff490;
  undefined4 uVar4;
  fitsfile *in_stack_fffffffffffff498;
  int *in_stack_fffffffffffff4c0;
  void *in_stack_fffffffffffff4c8;
  int *in_stack_fffffffffffff4d0;
  fitsfile *in_stack_fffffffffffff4d8;
  LONGLONG in_stack_fffffffffffff4e0;
  fitsfile *in_stack_fffffffffffff4e8;
  int local_4;
  
  if ((*in_RDX < 1) && (0 < in_RSI)) {
    uVar4 = 0;
    fptr_00 = (fitsfile *)
              (((*(long *)(*(long *)(in_RDI + 8) + 0x88) + *(long *)(*(long *)(in_RDI + 8) + 0x3d8)
                 + *(long *)(*(long *)(in_RDI + 8) + 0x3e0) + 0xb3f) / 0xb40) * 0xb40);
    status_00 = fptr_00 + in_RSI * -0xb4;
    while( true ) {
      iVar2 = ffmbyt(in_stack_fffffffffffff498,CONCAT44(uVar4,in_stack_fffffffffffff490),
                     (int)((ulong)fptr_00 >> 0x20),&status_00->HDUposition);
      bVar3 = 0;
      if (iVar2 == 0) {
        iVar2 = ffgbyt(in_stack_fffffffffffff4d8,(LONGLONG)in_stack_fffffffffffff4d0,
                       in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0);
        bVar3 = iVar2 != 0 ^ 0xff;
      }
      if ((bVar3 & 1) == 0) {
        memset(&stack0xfffffffffffff498,0,0xb40);
        ffmbyt(in_stack_fffffffffffff498,CONCAT44(uVar4,in_stack_fffffffffffff490),
               (int)((ulong)fptr_00 >> 0x20),&status_00->HDUposition);
        for (iVar2 = 0; iVar2 < in_RSI; iVar2 = iVar2 + 1) {
          ffpbyt(in_stack_fffffffffffff4e8,in_stack_fffffffffffff4e0,in_stack_fffffffffffff4d8,
                 in_stack_fffffffffffff4d0);
        }
        ffmbyt(in_stack_fffffffffffff498,CONCAT44(uVar4,iVar2),(int)((ulong)fptr_00 >> 0x20),
               &status_00->HDUposition);
        fftrun(fptr_00,(LONGLONG)status_00,(int *)CONCAT17(bVar3,in_stack_fffffffffffff478));
        for (iVar2 = *(int *)(*(long *)(in_RDI + 8) + 0x54);
            iVar2 <= *(int *)(*(long *)(in_RDI + 8) + 0x60); iVar2 = iVar2 + 1) {
          lVar1 = *(long *)(*(long *)(in_RDI + 8) + 0x68);
          *(long *)(lVar1 + (long)(iVar2 + 1) * 8) =
               *(long *)(lVar1 + (long)(iVar2 + 1) * 8) + in_RSI * -0xb40;
        }
        return *in_RDX;
      }
      ffmbyt(in_stack_fffffffffffff498,CONCAT44(uVar4,in_stack_fffffffffffff490),
             (int)((ulong)fptr_00 >> 0x20),&status_00->HDUposition);
      ffpbyt(in_stack_fffffffffffff4e8,in_stack_fffffffffffff4e0,in_stack_fffffffffffff4d8,
             in_stack_fffffffffffff4d0);
      if (0 < *in_RDX) break;
      fptr_00 = fptr_00 + 0xb4;
      status_00 = status_00 + 0xb4;
    }
    ffpmsg((char *)0x17359c);
    local_4 = *in_RDX;
  }
  else {
    local_4 = *in_RDX;
  }
  return local_4;
}

Assistant:

int ffdblk(fitsfile *fptr,      /* I - FITS file pointer                    */
           long nblocks,        /* I - number of 2880-byte blocks to delete */
           int *status)         /* IO - error status                        */
/*
  Delete the specified number of 2880-byte blocks from the end
  of the CHDU by shifting all following extensions up this 
  number of blocks.
*/
{
    char buffer[2880];
    int tstatus, ii;
    LONGLONG readpos, writepos;

    if (*status > 0 || nblocks <= 0)
        return(*status);

    tstatus = 0;
    /* pointers to the read and write positions */

    readpos = (fptr->Fptr)->datastart + 
                   (fptr->Fptr)->heapstart + 
                   (fptr->Fptr)->heapsize;
    readpos = ((readpos + 2879) / 2880) * 2880; /* start of block */

/*  the following formula is wrong because the current data unit
    may have been extended without updating the headstart value
    of the following HDU.
    
    readpos = (fptr->Fptr)->headstart[((fptr->Fptr)->curhdu) + 1];
*/
    writepos = readpos - ((LONGLONG)nblocks * 2880);

    while ( !ffmbyt(fptr, readpos, REPORT_EOF, &tstatus) &&
            !ffgbyt(fptr, 2880L, buffer, &tstatus) )
    {
        ffmbyt(fptr, writepos, REPORT_EOF, status);
        ffpbyt(fptr, 2880L, buffer, status);

        if (*status > 0)
        {
           ffpmsg("Error deleting FITS blocks (ffdblk)");
           return(*status);
        }
        readpos  += 2880;  /* increment to next block to transfer */
        writepos += 2880;
    }

    /* now fill the last nblock blocks with zeros */
    memset(buffer, 0, 2880);
    ffmbyt(fptr, writepos, REPORT_EOF, status);

    for (ii = 0; ii < nblocks; ii++)
        ffpbyt(fptr, 2880L, buffer, status);

    /* move back before the deleted blocks, since they may be deleted */
    /*   and we do not want to delete the current active buffer */
    ffmbyt(fptr, writepos - 1, REPORT_EOF, status);

    /* truncate the file to the new size, if supported on this device */
    fftrun(fptr, writepos, status);

    /* recalculate the starting location of all subsequent HDUs */
    for (ii = (fptr->Fptr)->curhdu; ii <= (fptr->Fptr)->maxhdu; ii++)
         (fptr->Fptr)->headstart[ii + 1] -= ((LONGLONG)nblocks * 2880);

    return(*status);
}